

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubeMap.cpp
# Opt level: O0

void __thiscall CubeMap::CubeMap(CubeMap *this,string *directory)

{
  string *local_228;
  Image *local_188;
  Image local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [8];
  string filename;
  int local_fc;
  allocator local_f6;
  allocator local_f5;
  int ii;
  string *local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string asStack_28 [16];
  string *local_18;
  string *directory_local;
  CubeMap *this_local;
  
  local_188 = this->_images;
  local_18 = directory;
  directory_local = (string *)this;
  do {
    Image::Image(local_188);
    local_188 = local_188 + 1;
  } while (local_188 != this[1]._images);
  local_f0 = local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"left",(allocator *)((long)&ii + 3));
  local_f0 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"right",(allocator *)((long)&ii + 2));
  local_f0 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"up",(allocator *)((long)&ii + 1));
  local_f0 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"down",(allocator *)&ii);
  local_f0 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"front",&local_f5);
  local_f0 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"back",&local_f6);
  std::allocator<char>::~allocator((allocator<char> *)&local_f6);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5);
  std::allocator<char>::~allocator((allocator<char> *)&ii);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ii + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&ii + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&ii + 3));
  for (local_fc = 0; local_fc < 6; local_fc = local_fc + 1) {
    std::operator+(local_160,(char *)local_18);
    std::operator+(local_140,local_160);
    std::operator+(local_120,(char *)local_140);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_160);
    Image::loadPNG(&local_180,local_120);
    Image::operator=(this->_images + local_fc,&local_180);
    Image::~Image(&local_180);
    std::__cxx11::string::~string((string *)local_120);
  }
  local_228 = asStack_28;
  do {
    local_228 = local_228 + -0x20;
    std::__cxx11::string::~string(local_228);
  } while (local_228 != local_e8);
  return;
}

Assistant:

CubeMap::CubeMap(const std::string &directory) {
    std::string side[6] = {"left", "right", "up", "down", "front", "back"};
    for (int ii = 0; ii < 6; ii++) {
        std::string filename = directory + "/" + side[ii] + ".png";
        _images[ii] = Image::loadPNG(filename);
    }

}